

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O2

void zzDoubleMod(word *b,word *a,word *mod,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  
  uVar2 = 1;
  uVar4 = 0;
  for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
    uVar1 = uVar4 + a[sVar3] * 2;
    uVar4 = a[sVar3] >> 0x3f;
    b[sVar3] = uVar1;
    if (mod[sVar3] != uVar1) {
      uVar2 = 0;
    }
    uVar2 = uVar2 | mod[sVar3] < uVar1;
  }
  zzSubAndW(b,mod,n,-(uVar2 | uVar4));
  return;
}

Assistant:

void SAFE(zzDoubleMod)(word b[], const word a[], const word mod[], size_t n)
{
	register word carry = 0;
	register word hi;
	register word mask = 1;
	size_t i;
	// pre
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	// b <- a * 2
	for (i = 0; i < n; ++i)
	{
		hi = a[i] >> (B_PER_W - 1);
		b[i] = a[i] << 1 | carry;
		carry = hi;
		// mask <- mod[i] < b[i] || mask && mod[i] == b[i];
		mask &= wordEq01(mod[i], b[i]);
		mask |= wordLess01(mod[i], b[i]);
	}
	// sub mod
	mask |= carry;
	mask = WORD_0 - mask;
	zzSubAndW(b, mod, n, mask);
	// очистка
	hi = carry = mask = 0;
}